

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

int __thiscall google::protobuf::FileOptions::ByteSize(FileOptions *this)

{
  string *psVar1;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  
  uVar6 = this->_has_bits_[0];
  if ((char)uVar6 == '\0') {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    if ((uVar6 & 1) != 0) {
      psVar1 = this->java_package_;
      uVar7 = (uint)psVar1->_M_string_length;
      iVar3 = 1;
      if (0x7f < uVar7) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        uVar7 = (uint)psVar1->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar3 = uVar7 + iVar3 + 1;
    }
    if ((uVar6 & 2) != 0) {
      psVar1 = this->java_outer_classname_;
      uVar7 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        uVar7 = (uint)psVar1->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar3 = iVar3 + uVar7 + iVar4 + 1;
    }
    uVar5 = uVar6 >> 1 & 2;
    uVar7 = uVar5 + 3;
    if ((uVar6 & 8) == 0) {
      uVar7 = uVar5;
    }
    iVar3 = uVar7 + iVar3;
    if ((uVar6 & 0x10) != 0) {
      uVar7 = this->optimize_for_;
      if ((int)uVar7 < 0) {
        iVar4 = 0xb;
      }
      else {
        iVar4 = 2;
        if (0x7f < uVar7) {
          iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
          iVar4 = iVar4 + 1;
          uVar6 = this->_has_bits_[0];
        }
      }
      iVar3 = iVar3 + iVar4;
    }
    if ((uVar6 & 0x20) != 0) {
      psVar1 = this->go_package_;
      uVar7 = (uint)psVar1->_M_string_length;
      iVar4 = 1;
      if (0x7f < uVar7) {
        iVar4 = io::CodedOutputStream::VarintSize32Fallback(uVar7);
        uVar7 = (uint)psVar1->_M_string_length;
        uVar6 = this->_has_bits_[0];
      }
      iVar3 = iVar3 + uVar7 + iVar4 + 1;
    }
    iVar4 = iVar3 + 3;
    if ((uVar6 & 0x40) == 0) {
      iVar4 = iVar3;
    }
    iVar3 = iVar4 + 3;
    if (-1 < (char)uVar6) {
      iVar3 = iVar4;
    }
  }
  iVar4 = iVar3 + 3;
  if ((uVar6 >> 8 & 1) == 0) {
    iVar4 = iVar3;
  }
  iVar3 = (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_;
  iVar4 = iVar4 + iVar3 * 2;
  if (0 < iVar3) {
    lVar8 = 0;
    do {
      uVar6 = UninterpretedOption::ByteSize
                        ((UninterpretedOption *)
                         (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar8]);
      iVar3 = 1;
      if (0x7f < uVar6) {
        iVar3 = io::CodedOutputStream::VarintSize32Fallback(uVar6);
      }
      iVar4 = iVar4 + uVar6 + iVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  iVar3 = internal::ExtensionSet::ByteSize(&this->_extensions_);
  iVar3 = iVar3 + iVar4;
  pvVar2 = (this->_unknown_fields_).fields_;
  if ((pvVar2 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar2->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    iVar4 = internal::WireFormat::ComputeUnknownFieldsSize(&this->_unknown_fields_);
    iVar3 = iVar3 + iVar4;
  }
  this->_cached_size_ = iVar3;
  return iVar3;
}

Assistant:

int FileOptions::ByteSize() const {
  int total_size = 0;

  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    // optional string java_package = 1;
    if (has_java_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_package());
    }

    // optional string java_outer_classname = 8;
    if (has_java_outer_classname()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->java_outer_classname());
    }

    // optional bool java_multiple_files = 10 [default = false];
    if (has_java_multiple_files()) {
      total_size += 1 + 1;
    }

    // optional bool java_generate_equals_and_hash = 20 [default = false];
    if (has_java_generate_equals_and_hash()) {
      total_size += 2 + 1;
    }

    // optional .google.protobuf.FileOptions.OptimizeMode optimize_for = 9 [default = SPEED];
    if (has_optimize_for()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::EnumSize(this->optimize_for());
    }

    // optional string go_package = 11;
    if (has_go_package()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->go_package());
    }

    // optional bool cc_generic_services = 16 [default = false];
    if (has_cc_generic_services()) {
      total_size += 2 + 1;
    }

    // optional bool java_generic_services = 17 [default = false];
    if (has_java_generic_services()) {
      total_size += 2 + 1;
    }

  }
  if (_has_bits_[8 / 32] & (0xffu << (8 % 32))) {
    // optional bool py_generic_services = 18 [default = false];
    if (has_py_generic_services()) {
      total_size += 2 + 1;
    }

  }
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  total_size += 2 * this->uninterpreted_option_size();
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    total_size +=
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        this->uninterpreted_option(i));
  }

  total_size += _extensions_.ByteSize();

  if (!unknown_fields().empty()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = total_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}